

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translations.c
# Opt level: O0

int gotcha_internal_libc_start_main
              (_func_int_int_char_ptr_ptr_char_ptr_ptr *main_arg,int argc,char **argv,
              _func_void_varargs *init,_func_void_varargs *fini,_func_void_varargs *rtld_fini,
              void *stack_end)

{
  int iVar1;
  code *pcVar2;
  void *pvVar3;
  main_t underlying_main;
  libc_start_main_t underlying_libc_main;
  _func_void_varargs *rtld_fini_local;
  _func_void_varargs *fini_local;
  _func_void_varargs *init_local;
  char **argv_local;
  int argc_local;
  _func_int_int_char_ptr_ptr_char_ptr_ptr *main_arg_local;
  
  pcVar2 = (code *)gotcha_get_wrappee(gotcha_internal_libc_main_wrappee_handle);
  pvVar3 = gotcha_get_wrappee(gotcha_internal_main_wrappee_handle);
  iVar1 = (*pcVar2)(pvVar3,argc,argv,init,fini,rtld_fini,stack_end);
  return iVar1;
}

Assistant:

int gotcha_internal_libc_start_main(int (*main_arg)(int, char **, char **)
                                        KNOWN_UNUSED,
                                    int argc, char **argv, void (*init)(),
                                    void (*fini)(), void (*rtld_fini)(),
                                    void *stack_end) {
  libc_start_main_t underlying_libc_main =
      gotcha_get_wrappee(gotcha_internal_libc_main_wrappee_handle);
  main_t underlying_main =
      gotcha_get_wrappee(gotcha_internal_main_wrappee_handle);
  return underlying_libc_main(underlying_main, argc, argv, init, fini,
                              rtld_fini, stack_end);
}